

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBuilderCableANCF::BuildBeam
          (ChBuilderCableANCF *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionCable> *sect,int N,ChVector<double> *A,
          ChVector<double> *B,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *nodes,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *node_nbrs)

{
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  *this_00;
  undefined8 *puVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  pointer pvVar3;
  pointer pvVar4;
  ChMesh *pCVar5;
  long lVar6;
  iterator iVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  ChElementCableANCF *this_01;
  pointer psVar11;
  int iVar12;
  value_type *__x;
  ulong uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  shared_ptr<chrono::fea::ChNodeFEAxyzD> nodeB;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> nodeA;
  ChVector<double> v_1;
  ChVector<double> v;
  int local_14c;
  value_type local_148;
  value_type local_138;
  ulong local_128;
  double local_120;
  shared_ptr<chrono::fea::ChMesh> *local_118;
  ChVector<double> *local_110;
  value_type local_108;
  shared_ptr<chrono::fea::ChElementBase> local_f8;
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  undefined8 local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_b8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_a8;
  double local_98;
  double local_90;
  double local_88;
  shared_ptr<chrono::fea::ChBeamSectionCable> *local_80;
  ChBuilderCableANCF *local_78;
  ChVector<double> *local_70;
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  local_118 = mesh;
  local_110 = A;
  local_80 = sect;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementCableANCF>,_std::allocator<std::shared_ptr<chrono::fea::ChElementCableANCF>_>_>
  ::clear(&this->beam_elems);
  this_00 = &this->beam_nodes;
  local_78 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ::clear(this_00);
  local_128 = CONCAT44(local_128._4_4_,N);
  pvVar3 = (node_nbrs->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar4 = (node_nbrs->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar15 = (long)(nodes->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(nodes->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar16 = lVar15 * -0x5555555555555555;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(nodes,uVar16 + (long)N);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(node_nbrs,(long)N + 1 + ((long)pvVar3 - (long)pvVar4 >> 3) * -0x5555555555555555);
  local_98 = B->m_data[1] - local_110->m_data[1];
  local_120 = B->m_data[0] - local_110->m_data[0];
  local_90 = B->m_data[2] - local_110->m_data[2];
  local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_98 * local_98;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_120;
  auVar18 = vfmadd231sd_fma(auVar18,auVar21,auVar21);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_90;
  auVar18 = vfmadd231sd_fma(auVar18,auVar23,auVar23);
  auVar18 = vsqrtsd_avx(auVar18,auVar18);
  dVar17 = 1.0 / auVar18._0_8_;
  bVar8 = 2.2250738585072014e-308 <= auVar18._0_8_;
  local_48.m_data[0] =
       (double)((ulong)bVar8 * (long)(local_120 * dVar17) + (ulong)!bVar8 * 0x3ff0000000000000);
  local_48.m_data[1] = (double)((ulong)bVar8 * (long)(local_98 * dVar17));
  local_48.m_data[2] = (double)((ulong)bVar8 * (long)(local_90 * dVar17));
  local_70 = B;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyzD,std::allocator<chrono::fea::ChNodeFEAxyzD>,chrono::ChVector<double>const&,chrono::ChVector<double>&>
            (&local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyzD **)&local_108,
             (allocator<chrono::fea::ChNodeFEAxyzD> *)&local_68,local_110,&local_48);
  pCVar5 = (local_118->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_a8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChMesh::AddNode(pCVar5,&local_a8);
  uVar13 = local_128;
  iVar12 = (int)local_128;
  if (local_a8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ::push_back(this_00,&local_108);
  if (0 < iVar12) {
    local_88 = (double)iVar12;
    local_128 = (uVar13 & 0xffffffff) << 4;
    iVar12 = 1;
    uVar13 = 0;
    lVar15 = lVar15 * 8;
    dVar17 = 1.0 / local_88;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar17 * local_98 * dVar17 * local_98;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar17 * local_120;
    auVar18 = vfmadd231sd_fma(auVar20,auVar22,auVar22);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar17 * local_90;
    auVar18 = vfmadd231sd_fma(auVar18,auVar19,auVar19);
    auVar18 = vsqrtsd_avx(auVar18,auVar18);
    local_120 = auVar18._0_8_;
    do {
      auVar18 = *(undefined1 (*) [16])local_110->m_data;
      local_138.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      auVar21 = vsubpd_avx(*(undefined1 (*) [16])local_70->m_data,auVar18);
      dVar17 = (double)iVar12 / local_88;
      local_68.m_data[2] =
           local_110->m_data[2] + dVar17 * (local_70->m_data[2] - local_110->m_data[2]);
      local_68.m_data[0] = auVar18._0_8_ + dVar17 * auVar21._0_8_;
      local_68.m_data[1] = auVar18._8_8_ + dVar17 * auVar21._8_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChNodeFEAxyzD,std::allocator<chrono::fea::ChNodeFEAxyzD>,chrono::ChVector<double>&,chrono::ChVector<double>&>
                (&local_138.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(ChNodeFEAxyzD **)&local_138,
                 (allocator<chrono::fea::ChNodeFEAxyzD> *)&local_148,&local_68,&local_48);
      pCVar5 = (local_118->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_b8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_138.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_b8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_138.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_138.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_138.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_138.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_138.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_138.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddNode(pCVar5,&local_b8);
      if (local_b8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      __x = &local_138;
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
      ::push_back(this_00,__x);
      this_01 = (ChElementCableANCF *)
                ChElementCableANCF::operator_new((ChElementCableANCF *)0xa40,(size_t)__x);
      ChElementCableANCF::ChElementCableANCF(this_01);
      local_148.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementCableANCF*>
                (&local_148.
                  super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_01);
      std::
      vector<std::shared_ptr<chrono::fea::ChElementCableANCF>,_std::allocator<std::shared_ptr<chrono::fea::ChElementCableANCF>_>_>
      ::push_back(&local_78->beam_elems,&local_148);
      psVar11 = (this_00->
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)
               ((long)&(psVar11->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + uVar13);
      local_c8 = *puVar1;
      p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
      lVar6 = *(long *)((long)&(psVar11->
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                               )._M_refcount._M_pi + uVar13);
      if (lVar6 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
          UNLOCK();
          psVar11 = (this_00->
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
        }
      }
      puVar1 = (undefined8 *)
               ((long)&psVar11[1].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + uVar13);
      local_d8 = *puVar1;
      p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
      lVar6 = *(long *)((long)&psVar11[1].
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + uVar13);
      if (lVar6 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar6 + 8) = *(int *)(lVar6 + 8) + 1;
        }
      }
      (*((local_148.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[0x1a])
                (local_148.
                 super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&local_c8,&local_d8);
      if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
      }
      if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
      }
      local_e8 = (local_80->
                 super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      local_e0._M_pi =
           (local_80->
           super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
        }
      }
      ((local_148.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->section).
      super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_e8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&((local_148.
                    super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_e0);
      if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
      }
      ((local_148.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChElementBeam).length = local_120;
      pCVar5 = (local_118->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_f8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_148.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_f8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_148.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_148.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_148.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_148.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_148.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_148.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddElement(pCVar5,&local_f8);
      if (local_f8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f8.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pvVar3 = (nodes->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_14c = (**(code **)(**(long **)((long)&(((this_00->
                                                                                                        
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + uVar13) + 0x28))();
      local_14c = local_14c + -1;
      iVar7._M_current =
           *(int **)((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish + lVar15);
      if (iVar7._M_current ==
          *(int **)((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage + lVar15)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar15),iVar7,&local_14c);
      }
      else {
        *iVar7._M_current = local_14c;
        *(int **)((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish + lVar15) = iVar7._M_current + 1;
      }
      pvVar3 = (nodes->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_14c = (**(code **)(**(long **)((long)&(((this_00->
                                                                                                        
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + uVar13) + 0x28))();
      iVar7._M_current =
           *(int **)((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish + lVar15);
      if (iVar7._M_current ==
          *(int **)((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage + lVar15)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar15),iVar7,&local_14c);
      }
      else {
        *iVar7._M_current = local_14c;
        *(int **)((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish + lVar15) = iVar7._M_current + 1;
      }
      iVar9 = (**(code **)(**(long **)((long)&(((this_00->
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + uVar13) + 0x28))();
      iVar14 = (int)uVar16;
      pvVar2 = (node_nbrs->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + (iVar9 - 1);
      iVar7._M_current =
           (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      local_14c = iVar14;
      if (iVar7._M_current ==
          (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar2,iVar7,&local_14c);
      }
      else {
        *iVar7._M_current = iVar14;
        (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar7._M_current + 1;
      }
      uVar10 = (**(code **)(**(long **)((long)&(((this_00->
                                                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr + uVar13) + 0x28))();
      pvVar2 = (node_nbrs->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar10;
      iVar7._M_current =
           (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar7._M_current ==
          (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        local_14c = iVar14;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar2,iVar7,&local_14c);
      }
      else {
        *iVar7._M_current = iVar14;
        (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar7._M_current + 1;
        local_14c = iVar14;
      }
      if (local_148.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.
                   super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_138.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_138.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar16 = (ulong)(iVar14 + 1);
      lVar15 = lVar15 + 0x18;
      uVar13 = uVar13 + 0x10;
      iVar12 = iVar12 + 1;
    } while (local_128 != uVar13);
  }
  if (local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChBuilderCableANCF::BuildBeam(std::shared_ptr<ChMesh> mesh,              // mesh to store the resulting elements
                                   std::shared_ptr<ChBeamSectionCable> sect,  // section material for beam elements
                                   const int N,                               // number of elements in the segment
                                   const ChVector<> A,                        // starting point
                                   const ChVector<> B,                        // ending point
                                   std::vector<std::vector<int>>& nodes,      // node indices for all elements
                                   std::vector<std::vector<int>>& node_nbrs   // neighbor node indices (connectivity)
) {
    beam_elems.clear();
    beam_nodes.clear();
    auto n_nodes = nodes.size();
    auto n_nbrs = node_nbrs.size();

    nodes.resize(N + n_nodes);
    node_nbrs.resize(N + 1 + n_nbrs);
    ChVector<> bdir = (B - A);
    bdir.Normalize();

    double restlength = ((B - A) / N).Length();

    auto nodeA = chrono_types::make_shared<ChNodeFEAxyzD>(A, bdir);
    mesh->AddNode(nodeA);
    beam_nodes.push_back(nodeA);

    for (int i = 0; i < N; i++) {
        double eta = (i + 1.0) / N;
        ChVector<> pos = A + (B - A) * eta;

        auto nodeB = chrono_types::make_shared<ChNodeFEAxyzD>(pos, bdir);
        mesh->AddNode(nodeB);
        beam_nodes.push_back(nodeB);

        auto element = chrono_types::make_shared<ChElementCableANCF>();

        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i], beam_nodes[i + 1]);

        element->SetSection(sect);

        element->SetRestLength(restlength);
        
        mesh->AddElement(element);

        nodes[n_nodes + i].push_back(beam_nodes[i]->GetIndex() - 1);
        nodes[n_nodes + i].push_back(beam_nodes[i]->GetIndex());

        node_nbrs[beam_nodes[i]->GetIndex() - 1].push_back((int)n_nodes + i);
        node_nbrs[beam_nodes[i]->GetIndex()].push_back((int)n_nodes + i);
    }
}